

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void * sqlite3ParserAddCleanup(Parse *pParse,_func_void_sqlite3_ptr_void_ptr *xCleanup,void *pPtr)

{
  int iVar1;
  ParseCleanup *local_28;
  ParseCleanup *pCleanup;
  void *pPtr_local;
  _func_void_sqlite3_ptr_void_ptr *xCleanup_local;
  Parse *pParse_local;
  
  iVar1 = sqlite3FaultSim(300);
  if (iVar1 == 0) {
    local_28 = (ParseCleanup *)sqlite3DbMallocRaw(pParse->db,0x18);
  }
  else {
    local_28 = (ParseCleanup *)0x0;
    sqlite3OomFault(pParse->db);
  }
  if (local_28 == (ParseCleanup *)0x0) {
    (*xCleanup)(pParse->db,pPtr);
    pCleanup = (ParseCleanup *)0x0;
  }
  else {
    local_28->pNext = pParse->pCleanup;
    pParse->pCleanup = local_28;
    local_28->pPtr = pPtr;
    local_28->xCleanup = xCleanup;
    pCleanup = (ParseCleanup *)pPtr;
  }
  return pCleanup;
}

Assistant:

SQLITE_PRIVATE void *sqlite3ParserAddCleanup(
  Parse *pParse,                      /* Destroy when this Parser finishes */
  void (*xCleanup)(sqlite3*,void*),   /* The cleanup routine */
  void *pPtr                          /* Pointer to object to be cleaned up */
){
  ParseCleanup *pCleanup;
  if( sqlite3FaultSim(300) ){
    pCleanup = 0;
    sqlite3OomFault(pParse->db);
  }else{
    pCleanup = sqlite3DbMallocRaw(pParse->db, sizeof(*pCleanup));
  }
  if( pCleanup ){
    pCleanup->pNext = pParse->pCleanup;
    pParse->pCleanup = pCleanup;
    pCleanup->pPtr = pPtr;
    pCleanup->xCleanup = xCleanup;
  }else{
    xCleanup(pParse->db, pPtr);
    pPtr = 0;
#if defined(SQLITE_DEBUG) || defined(SQLITE_COVERAGE_TEST)
    pParse->earlyCleanup = 1;
#endif
  }
  return pPtr;
}